

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O0

void slist_data(Symbol *s,int indx,int findx)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int n;
  int i;
  int *pi;
  uint in_stack_ffffffffffffffe4;
  
  if (*(long *)(in_RDI + 0x18) == 0) {
    pcVar4 = emalloc(in_stack_ffffffffffffffe4);
    *(char **)(in_RDI + 0x18) = pcVar4;
    pcVar4[0] = '\x01';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    *(int *)(pcVar4 + 4) = in_EDX;
    *(int *)(pcVar4 + 8) = in_ESI;
  }
  else {
    iVar2 = **(int **)(in_RDI + 0x18);
    iVar1 = iVar2 + 1;
    piVar3 = (int *)emalloc(in_stack_ffffffffffffffe4);
    for (iVar2 = iVar2 * 2; 0 < iVar2; iVar2 = iVar2 + -1) {
      piVar3[iVar2] = *(int *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 4);
    }
    free(*(void **)(in_RDI + 0x18));
    *(int **)(in_RDI + 0x18) = piVar3;
    *piVar3 = iVar1;
    piVar3[iVar1 * 2 + -1] = in_EDX;
    piVar3[iVar1 * 2] = in_ESI;
  }
  return;
}

Assistant:

void slist_data(s, indx, findx) Symbol* s; int indx, findx; {
	/* format: number of pairs, followed by findx, indx pairs */
	int* pi;
	int i, n;
	if (s->slist_info_) {
		/* i'd use realloc but to avoid portability problems */
		/* this probably will never get executed anyway */
		n = s->slist_info_[0] + 1;
		pi = (int*)emalloc((1 + 2*n)*sizeof(int));
		for (i=2*(n-1); i > 0; --i) {
			pi[i] = s->slist_info_[i];
		}
		free(s->slist_info_);
		s->slist_info_ = pi;
		pi[0] = n;
		pi[2*n-1] = findx;
		pi[2*n] = indx;
	}else{
		s->slist_info_ = pi = (int*)emalloc(3*sizeof(int));
		pi[0] = 1;
		pi[1] = findx;
		pi[2] = indx;
	}
}